

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O1

ssize_t __thiscall
hbm::SocketNonblocking::sendBlock(SocketNonblocking *this,void *pBlock,size_t size,bool more)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined7 in_register_00000009;
  size_t __n;
  pollfd pfd;
  pollfd local_38;
  
  local_38.fd = this->m_fd;
  local_38.events = 4;
  if (size != 0) {
    __n = size;
    do {
      sVar2 = send(this->m_fd,pBlock,__n,(int)CONCAT71(in_register_00000009,more) << 0xf);
      if (sVar2 < 1) {
        if (sVar2 == 0) {
          __n = 0;
          size = 0xffffffffffffffff;
        }
        else {
          piVar3 = __errno_location();
          if (*piVar3 == 0xb) {
            do {
              iVar1 = poll(&local_38,1,-1);
              if (iVar1 != -1) break;
            } while (*piVar3 == 4);
            if (iVar1 == 1) goto LAB_0011a3b5;
          }
          __n = 0;
          size = 0xffffffffffffffff;
        }
      }
      else {
        pBlock = (void *)((long)pBlock + sVar2);
        __n = __n - sVar2;
      }
LAB_0011a3b5:
    } while (__n != 0);
  }
  return size;
}

Assistant:

ssize_t hbm::SocketNonblocking::sendBlock(const void* pBlock, size_t size, bool more)
{
	const uint8_t* pDat = reinterpret_cast<const uint8_t*>(pBlock);
	size_t BytesLeft = size;
	ssize_t numBytes;
	ssize_t retVal = size;

	struct pollfd pfd;
	pfd.fd = m_fd;
	pfd.events = POLLOUT;

	int flags = 0;
	if(more) {
		flags |= MSG_MORE;
	}
	int err;

	while (BytesLeft > 0) {
		numBytes = send(m_fd, pDat, BytesLeft, flags);
		if(numBytes>0) {
			pDat += numBytes;
			BytesLeft -= numBytes;
		} else if(numBytes==0) {
			// connection lost...
			BytesLeft = 0;
			retVal = -1;
		} else {
			// <0
			if(errno==EWOULDBLOCK || errno==EAGAIN) {
				// wait for socket to become writable.
				do {
					err = poll(&pfd, 1, -1);
				} while((err==-1) && (errno==EINTR));
				if(err!=1) {
					BytesLeft = 0;
					retVal = -1;
				}
			} else {
				// a real error happened!
				BytesLeft = 0;
				retVal = -1;
			}
		}
	}
	return retVal;
}